

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O0

void af_latin_metrics_init_widths(AF_LatinMetrics metrics,FT_Face face)

{
  int iVar1;
  FT_Error FVar2;
  long lVar3;
  ulong local_c318;
  FT_Pos stdw;
  AF_LatinAxis axis_1;
  FT_Pos dist;
  AF_Segment_conflict pAStack_c2f0;
  FT_UInt num_widths;
  AF_Segment_conflict link;
  AF_Segment_conflict limit;
  AF_Segment_conflict seg;
  AF_AxisHints axhints;
  AF_LatinAxis axis;
  char *pcStack_c2c0;
  uint num_idx;
  char *p;
  void *shaper_buf;
  AF_ScriptClass script_class;
  AF_StyleClass style_class;
  AF_Scaler scaler;
  AF_LatinMetricsRec dummy [1];
  AF_Dimension local_32ac;
  FT_ULong FStack_32a8;
  int dim;
  FT_ULong glyph_index;
  undefined1 local_3298 [4];
  FT_Error error;
  AF_GlyphHintsRec hints [1];
  FT_Face face_local;
  AF_LatinMetrics metrics_local;
  
  af_glyph_hints_init((AF_GlyphHints)local_3298,face->memory);
  metrics->axis[0].width_count = 0;
  metrics->axis[1].width_count = 0;
  style_class = (AF_StyleClass)dummy;
  script_class = (AF_ScriptClass)(metrics->root).style_class;
  shaper_buf = af_script_classes[*(AF_Script *)&script_class->script_uni_ranges];
  pcStack_c2c0 = ((AF_ScriptClass)shaper_buf)->standard_charstring;
  p = (char *)af_shaper_buf_create(face);
  FStack_32a8 = 0;
  do {
    if (*pcStack_c2c0 == '\0') break;
    for (; *pcStack_c2c0 == ' '; pcStack_c2c0 = pcStack_c2c0 + 1) {
    }
    pcStack_c2c0 = af_shaper_get_cluster(pcStack_c2c0,&metrics->root,p,(uint *)((long)&axis + 4));
  } while ((1 < axis._4_4_) ||
          (FStack_32a8 = af_shaper_get_elem(&metrics->root,p,0,(FT_Long *)0x0,(FT_Long *)0x0),
          FStack_32a8 == 0));
  af_shaper_buf_destroy(face,p);
  if ((FStack_32a8 != 0) &&
     ((FVar2 = FT_Load_Glyph(face,(FT_UInt)FStack_32a8,1), FVar2 == 0 &&
      (0 < (face->glyph->outline).n_points)))) {
    memset(&scaler,0,0x8fe0);
    dummy[0].root.globals._0_4_ = metrics->units_per_em;
    style_class->script = 0x10000;
    style_class->blue_stringset = AF_BLUE_STRINGSET_ADLM;
    *(undefined8 *)&style_class->coverage = 0x10000;
    style_class[1].writing_system = AF_WRITING_SYSTEM_DUMMY;
    style_class[1].script = AF_SCRIPT_ADLM;
    style_class[1].blue_stringset = AF_BLUE_STRINGSET_ADLM;
    style_class[1].coverage = AF_COVERAGE_PETITE_CAPITALS_FROM_CAPITALS;
    *(FT_Face *)style_class = face;
    style_class[2].style = AF_STYLE_ADLM_DFLT;
    style_class[2].writing_system = AF_WRITING_SYSTEM_DUMMY;
    af_glyph_hints_rescale((AF_GlyphHints)local_3298,(AF_StyleMetrics_conflict)&scaler);
    FVar2 = af_glyph_hints_reload((AF_GlyphHints)local_3298,&face->glyph->outline);
    if (FVar2 == 0) {
      for (local_32ac = AF_DIMENSION_HORZ; (int)local_32ac < 2;
          local_32ac = local_32ac + AF_DIMENSION_VERT) {
        axhints = (AF_AxisHints)(metrics->axis + (int)local_32ac);
        seg = (AF_Segment_conflict)
              &hints[0].axis[(long)(int)local_32ac + -1].embedded.edges[0xb].last;
        dist._4_4_ = 0;
        FVar2 = af_latin_hints_compute_segments((AF_GlyphHints)local_3298,local_32ac);
        if (FVar2 != 0) break;
        af_latin_hints_link_segments((AF_GlyphHints)local_3298,0,(AF_WidthRec *)0x0,local_32ac);
        limit = *(AF_Segment_conflict *)&seg->max_coord;
        iVar1._0_1_ = seg->flags;
        iVar1._1_1_ = seg->dir;
        iVar1._2_2_ = seg->pos;
        link = limit + iVar1;
        for (; limit < link; limit = limit + 1) {
          pAStack_c2f0 = limit->link;
          if (((pAStack_c2f0 != (AF_Segment_conflict)0x0) && (pAStack_c2f0->link == limit)) &&
             (limit < pAStack_c2f0)) {
            axis_1 = (AF_LatinAxis)(long)((int)limit->pos - (int)pAStack_c2f0->pos);
            if ((long)axis_1 < 0) {
              axis_1 = (AF_LatinAxis)-(long)axis_1;
            }
            if (dist._4_4_ < 0x10) {
              *(AF_LatinAxis *)
               ((long)(axhints->embedded).segments + (ulong)dist._4_4_ * 0x18 + -0x10) = axis_1;
              dist._4_4_ = dist._4_4_ + 1;
            }
          }
        }
        af_sort_and_quantize_widths
                  ((FT_UInt *)((long)&dist + 4),(AF_Width)&axhints->edges,
                   (ulong)(FT_UInt)dummy[0].root.globals / 100);
        axhints->num_edges = dist._4_4_;
      }
    }
  }
  for (local_32ac = 0; (int)local_32ac < 2; local_32ac = local_32ac + 1) {
    lVar3 = (long)(int)local_32ac;
    if (metrics->axis[lVar3].width_count == 0) {
      local_c318 = ((ulong)metrics->units_per_em * 0x32) / 0x800;
    }
    else {
      local_c318 = metrics->axis[lVar3].widths[0].org;
    }
    metrics->axis[lVar3].edge_distance_threshold = (long)local_c318 / 5;
    metrics->axis[lVar3].standard_width = local_c318;
    metrics->axis[lVar3].extra_light = '\0';
  }
  af_glyph_hints_done((AF_GlyphHints)local_3298);
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_latin_metrics_init_widths( AF_LatinMetrics  metrics,
                                FT_Face          face )
  {
    /* scan the array of segments in each direction */
    AF_GlyphHintsRec  hints[1];


    FT_TRACE5(( "\n"
                "latin standard widths computation (style `%s')\n"
                "=====================================================\n"
                "\n",
                af_style_names[metrics->root.style_class->style] ));

    af_glyph_hints_init( hints, face->memory );

    metrics->axis[AF_DIMENSION_HORZ].width_count = 0;
    metrics->axis[AF_DIMENSION_VERT].width_count = 0;

    {
      FT_Error            error;
      FT_ULong            glyph_index;
      int                 dim;
      AF_LatinMetricsRec  dummy[1];
      AF_Scaler           scaler = &dummy->root.scaler;

#ifdef FT_CONFIG_OPTION_PIC
      AF_FaceGlobals  globals = metrics->root.globals;
#endif

      AF_StyleClass   style_class  = metrics->root.style_class;
      AF_ScriptClass  script_class = AF_SCRIPT_CLASSES_GET
                                       [style_class->script];

      void*        shaper_buf;
      const char*  p;

#ifdef FT_DEBUG_LEVEL_TRACE
      FT_ULong  ch = 0;
#endif

      p          = script_class->standard_charstring;
      shaper_buf = af_shaper_buf_create( face );

      /*
       * We check a list of standard characters to catch features like
       * `c2sc' (small caps from caps) that don't contain lowercase letters
       * by definition, or other features that mainly operate on numerals.
       * The first match wins.
       */

      glyph_index = 0;
      while ( *p )
      {
        unsigned int  num_idx;

#ifdef FT_DEBUG_LEVEL_TRACE
        const char*  p_old;
#endif


        while ( *p == ' ' )
          p++;

#ifdef FT_DEBUG_LEVEL_TRACE
        p_old = p;
        GET_UTF8_CHAR( ch, p_old );
#endif

        /* reject input that maps to more than a single glyph */
        p = af_shaper_get_cluster( p, &metrics->root, shaper_buf, &num_idx );
        if ( num_idx > 1 )
          continue;

        /* otherwise exit loop if we have a result */
        glyph_index = af_shaper_get_elem( &metrics->root,
                                          shaper_buf,
                                          0,
                                          NULL,
                                          NULL );
        if ( glyph_index )
          break;
      }

      af_shaper_buf_destroy( face, shaper_buf );

      if ( !glyph_index )
        goto Exit;

      FT_TRACE5(( "standard character: U+%04lX (glyph index %d)\n",
                  ch, glyph_index ));

      error = FT_Load_Glyph( face, glyph_index, FT_LOAD_NO_SCALE );
      if ( error || face->glyph->outline.n_points <= 0 )
        goto Exit;

      FT_ZERO( dummy );

      dummy->units_per_em = metrics->units_per_em;

      scaler->x_scale = 0x10000L;
      scaler->y_scale = 0x10000L;
      scaler->x_delta = 0;
      scaler->y_delta = 0;

      scaler->face        = face;
      scaler->render_mode = FT_RENDER_MODE_NORMAL;
      scaler->flags       = 0;

      af_glyph_hints_rescale( hints, (AF_StyleMetrics)dummy );

      error = af_glyph_hints_reload( hints, &face->glyph->outline );
      if ( error )
        goto Exit;

      for ( dim = 0; dim < AF_DIMENSION_MAX; dim++ )
      {
        AF_LatinAxis  axis    = &metrics->axis[dim];
        AF_AxisHints  axhints = &hints->axis[dim];
        AF_Segment    seg, limit, link;
        FT_UInt       num_widths = 0;


        error = af_latin_hints_compute_segments( hints,
                                                 (AF_Dimension)dim );
        if ( error )
          goto Exit;

        /*
         *  We assume that the glyphs selected for the stem width
         *  computation are `featureless' enough so that the linking
         *  algorithm works fine without adjustments of its scoring
         *  function.
         */
        af_latin_hints_link_segments( hints,
                                      0,
                                      NULL,
                                      (AF_Dimension)dim );

        seg   = axhints->segments;
        limit = seg + axhints->num_segments;

        for ( ; seg < limit; seg++ )
        {
          link = seg->link;

          /* we only consider stem segments there! */
          if ( link && link->link == seg && link > seg )
          {
            FT_Pos  dist;


            dist = seg->pos - link->pos;
            if ( dist < 0 )
              dist = -dist;

            if ( num_widths < AF_LATIN_MAX_WIDTHS )
              axis->widths[num_widths++].org = dist;
          }
        }

        /* this also replaces multiple almost identical stem widths */
        /* with a single one (the value 100 is heuristic)           */
        af_sort_and_quantize_widths( &num_widths, axis->widths,
                                     dummy->units_per_em / 100 );
        axis->width_count = num_widths;
      }

    Exit:
      for ( dim = 0; dim < AF_DIMENSION_MAX; dim++ )
      {
        AF_LatinAxis  axis = &metrics->axis[dim];
        FT_Pos        stdw;


        stdw = ( axis->width_count > 0 ) ? axis->widths[0].org
                                         : AF_LATIN_CONSTANT( metrics, 50 );

        /* let's try 20% of the smallest width */
        axis->edge_distance_threshold = stdw / 5;
        axis->standard_width          = stdw;
        axis->extra_light             = 0;

#ifdef FT_DEBUG_LEVEL_TRACE
        {
          FT_UInt  i;


          FT_TRACE5(( "%s widths:\n",
                      dim == AF_DIMENSION_VERT ? "horizontal"
                                               : "vertical" ));

          FT_TRACE5(( "  %d (standard)", axis->standard_width ));
          for ( i = 1; i < axis->width_count; i++ )
            FT_TRACE5(( " %d", axis->widths[i].org ));

          FT_TRACE5(( "\n" ));
        }
#endif
      }
    }

    FT_TRACE5(( "\n" ));

    af_glyph_hints_done( hints );
  }